

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programStreamDemuxer.h
# Opt level: O2

int64_t __thiscall ProgramStreamDemuxer::getTrackDelay(ProgramStreamDemuxer *this,int32_t pid)

{
  iterator iVar1;
  mapped_type *pmVar2;
  int64_t iVar3;
  long lVar4;
  key_type_conflict local_14;
  
  iVar1 = std::
          _Rb_tree<int,_std::pair<const_int,_long>,_std::_Select1st<std::pair<const_int,_long>_>,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>
          ::find(&(this->m_firstPtsTime)._M_t,&local_14);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->m_firstPtsTime)._M_t._M_impl.super__Rb_tree_header
     ) {
    iVar3 = 0;
  }
  else {
    pmVar2 = std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
             operator[](&this->m_firstPtsTime,&local_14);
    lVar4 = this->m_firstVideoPTS;
    if (lVar4 == -1) {
      lVar4 = this->m_firstPTS;
    }
    iVar3 = llround((double)(*pmVar2 - lVar4) / 90.0);
  }
  return iVar3;
}

Assistant:

int64_t getTrackDelay(const int32_t pid) override
    {
        if (m_firstPtsTime.find(pid) != m_firstPtsTime.end())
            return llround(
                static_cast<double>(m_firstPtsTime[pid] - (m_firstVideoPTS != -1 ? m_firstVideoPTS : m_firstPTS)) /
                90.0);  // convert to ms

        return 0;
    }